

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation_test.cc
# Opt level: O3

void __thiscall
DebugAllocationTest_StompAfter_Test::TestBody(DebugAllocationTest_StompAfter_Test *this)

{
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var1;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  bool bVar3;
  int iVar4;
  char *message;
  long lVar5;
  StringLike<const_char_*> *regex;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var6;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_78;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  AssertHelper local_40;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  DeathTest *gtest_dt;
  
  local_60._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(4);
  (*noopt_helper)((PolymorphicMatcher *)&local_60);
  _Var1._M_head_impl = local_60._M_head_impl;
  *(undefined4 *)(local_60._M_head_impl + 4) = 5;
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_40.data_ = (AssertHelperData *)0x13e1d9;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)&local_60,
               (testing *)&local_40,regex);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_78,(PolymorphicMatcher *)&local_60);
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
    bVar3 = testing::internal::DeathTest::Create
                      ("delete pint",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_78,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
                       ,0x83,(DeathTest **)&local_38);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_78);
    _Var6._M_head_impl = local_38;
    if (bVar3) {
      if (local_38 == (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         ) {
        return;
      }
      iVar4 = (**(code **)(*(long *)local_38 + 0x10))(local_38);
      pbVar2 = local_38;
      if (iVar4 == 0) {
        iVar4 = (**(code **)(*(long *)local_38 + 0x18))(local_38);
        bVar3 = testing::internal::ExitedUnsuccessfully(iVar4);
        iVar4 = (**(code **)(*(long *)local_38 + 0x20))(local_38,(ulong)bVar3);
        if ((char)iVar4 == '\0') {
          (**(code **)(*(long *)_Var6._M_head_impl + 8))(_Var6._M_head_impl);
          goto LAB_0010cbad;
        }
      }
      else if (iVar4 == 1) {
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3) {
          operator_delete(_Var1._M_head_impl,4);
        }
        (**(code **)(*(long *)local_38 + 0x28))(local_38,2);
        (**(code **)(*(long *)pbVar2 + 0x28))(pbVar2,0);
      }
      lVar5 = *(long *)_Var6._M_head_impl;
      goto LAB_0010cbfa;
    }
  }
LAB_0010cbad:
  testing::Message::Message((Message *)&local_60);
  message = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (&local_40,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/debugallocation_test.cc"
             ,0x83,message);
  testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_60);
  testing::internal::AssertHelper::~AssertHelper(&local_40);
  if (local_60._M_head_impl ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    return;
  }
  lVar5 = *(long *)local_60._M_head_impl;
  _Var6._M_head_impl = local_60._M_head_impl;
LAB_0010cbfa:
  (**(code **)(lVar5 + 8))(_Var6._M_head_impl);
  return;
}

Assistant:

TEST(DebugAllocationTest, StompAfter) {
  int* pint = noopt(new int);
  (void)pint;
  pint[1] = 5;
  EXPECT_DEATH(delete pint, "a word after object");
}